

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

CBString * __thiscall Bstrlib::CBString::operator=(CBString *this,char *s)

{
  uchar *__dest;
  size_t sVar1;
  CBStringException *pCVar2;
  ulong uVar3;
  char *__s;
  allocator local_a9;
  CBStringException bstr__cppwrapper_exception;
  string local_80;
  string local_60;
  string local_40;
  
  uVar3 = (ulong)(this->super_tagbstring).mlen;
  if ((long)uVar3 < 1) {
    std::__cxx11::string::string((string *)&local_40,"CBString::Write protection error",&local_a9);
    CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  __s = anon_var_dwarf_2f785 + 0x10;
  if (s != (char *)0x0) {
    __s = s;
  }
  sVar1 = strlen(__s);
  if (uVar3 <= sVar1) {
    if (0x7ffffffd < sVar1) {
      std::__cxx11::string::string
                ((string *)&local_60,
                 "CBString::Failure in =(const char *) operator, string too large",&local_a9);
      CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
      CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
      __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
    }
    alloc(this,(int)sVar1);
  }
  __dest = (this->super_tagbstring).data;
  if (__dest != (uchar *)0x0) {
    (this->super_tagbstring).slen = (int)sVar1;
    memcpy(__dest,__s,sVar1 + 1);
    return this;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  std::__cxx11::string::string
            ((string *)&local_80,"CBString::Failure in =(const char *) operator",&local_a9);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&bstr__cppwrapper_exception);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator = (const char *s) {
size_t tmpSlen;

	if (mlen <= 0) bstringThrow ("Write protection error");
	if (NULL == s) s = "";
	if ((tmpSlen = strlen (s)) >= (size_t) mlen) {
		if (tmpSlen >= INT_MAX-1) bstringThrow ("Failure in =(const char *) operator, string too large");
		alloc ((int) tmpSlen);
	}

	if (data) {
		slen = (int) tmpSlen;
		bstr__memcpy (data, s, tmpSlen + 1);
	} else {
		mlen = slen = 0;
		bstringThrow ("Failure in =(const char *) operator");
	}
	return *this;
}